

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O2

void nop_random_cb(uv_random_t *req,int status,void *buf,size_t len)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (status == -0x7d) {
    if (req + 1 == (uv_random_t *)buf) {
      if (len == 1) {
        done_cb_called = done_cb_called + 1;
        return;
      }
      pcVar2 = "len == sizeof(ri->buf)";
      uVar1 = 0x9e;
    }
    else {
      pcVar2 = "buf == (void*) ri->buf";
      uVar1 = 0x9d;
    }
  }
  else {
    pcVar2 = "status == UV_ECANCELED";
    uVar1 = 0x9c;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
          ,uVar1,pcVar2);
  abort();
}

Assistant:

static void nop_random_cb(uv_random_t* req, int status, void* buf, size_t len) {
  struct random_info* ri;

  ri = container_of(req, struct random_info, random_req);

  ASSERT(status == UV_ECANCELED);
  ASSERT(buf == (void*) ri->buf);
  ASSERT(len == sizeof(ri->buf));

  done_cb_called++;
}